

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void NavScrollToBringItemIntoView(ImGuiWindow *window,ImRect *item_rect)

{
  ImGuiContext *pIVar1;
  bool bVar2;
  ImRect *in_RSI;
  long in_RDI;
  ImGuiContext *g;
  ImRect window_rect;
  ImVec2 *in_stack_ffffffffffffff88;
  ImVec2 local_40;
  ImVec2 local_38;
  ImVec2 local_30;
  ImVec2 local_28;
  ImRect local_20;
  ImRect *local_10;
  long local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  ImVec2::ImVec2(&local_30,1.0,1.0);
  local_28 = operator-(in_stack_ffffffffffffff88,(ImVec2 *)0x15613d);
  ImVec2::ImVec2(&local_40,1.0,1.0);
  local_38 = operator+(in_stack_ffffffffffffff88,(ImVec2 *)0x15617a);
  ImRect::ImRect(&local_20,&local_28,&local_38);
  bVar2 = ImRect::Contains(&local_20,local_10);
  pIVar1 = GImGui;
  if (!bVar2) {
    if (((*(byte *)(local_8 + 0x7c) & 1) == 0) || (local_20.Min.x <= (local_10->Min).x)) {
      if (((*(byte *)(local_8 + 0x7c) & 1) != 0) && (local_20.Max.x <= (local_10->Max).x)) {
        *(float *)(local_8 + 100) =
             ((local_10->Max).x - *(float *)(local_8 + 0x10)) + *(float *)(local_8 + 0x5c) +
             (GImGui->Style).ItemSpacing.x;
        *(undefined4 *)(local_8 + 0x6c) = 0x3f800000;
      }
    }
    else {
      *(float *)(local_8 + 100) =
           (((local_10->Min).x - *(float *)(local_8 + 0x10)) + *(float *)(local_8 + 0x5c)) -
           (GImGui->Style).ItemSpacing.x;
      *(undefined4 *)(local_8 + 0x6c) = 0;
    }
    if (local_20.Min.y <= (local_10->Min).y) {
      if (local_20.Max.y <= (local_10->Max).y) {
        *(float *)(local_8 + 0x68) =
             ((local_10->Max).y - *(float *)(local_8 + 0x14)) + *(float *)(local_8 + 0x60) +
             (pIVar1->Style).ItemSpacing.y;
        *(undefined4 *)(local_8 + 0x70) = 0x3f800000;
      }
    }
    else {
      *(float *)(local_8 + 0x68) =
           (((local_10->Min).y - *(float *)(local_8 + 0x14)) + *(float *)(local_8 + 0x60)) -
           (pIVar1->Style).ItemSpacing.y;
      *(undefined4 *)(local_8 + 0x70) = 0;
    }
  }
  return;
}

Assistant:

static void NavScrollToBringItemIntoView(ImGuiWindow* window, const ImRect& item_rect)
{
    ImRect window_rect(window->InnerMainRect.Min - ImVec2(1, 1), window->InnerMainRect.Max + ImVec2(1, 1));
    //GetOverlayDrawList(window)->AddRect(window_rect.Min, window_rect.Max, IM_COL32_WHITE); // [DEBUG]
    if (window_rect.Contains(item_rect))
        return;

    ImGuiContext& g = *GImGui;
    if (window->ScrollbarX && item_rect.Min.x < window_rect.Min.x)
    {
        window->ScrollTarget.x = item_rect.Min.x - window->Pos.x + window->Scroll.x - g.Style.ItemSpacing.x;
        window->ScrollTargetCenterRatio.x = 0.0f;
    }
    else if (window->ScrollbarX && item_rect.Max.x >= window_rect.Max.x)
    {
        window->ScrollTarget.x = item_rect.Max.x - window->Pos.x + window->Scroll.x + g.Style.ItemSpacing.x;
        window->ScrollTargetCenterRatio.x = 1.0f;
    }
    if (item_rect.Min.y < window_rect.Min.y)
    {
        window->ScrollTarget.y = item_rect.Min.y - window->Pos.y + window->Scroll.y - g.Style.ItemSpacing.y;
        window->ScrollTargetCenterRatio.y = 0.0f;
    }
    else if (item_rect.Max.y >= window_rect.Max.y)
    {
        window->ScrollTarget.y = item_rect.Max.y - window->Pos.y + window->Scroll.y + g.Style.ItemSpacing.y;
        window->ScrollTargetCenterRatio.y = 1.0f;
    }
}